

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void flatbuffers::tests::JsonDefaultTest(string *tests_data_path)

{
  undefined8 path;
  bool bVar1;
  flatbuffers *this;
  char *pcVar2;
  size_t buffer_minalign;
  uint8_t *flatbuffer;
  long lVar3;
  string *in_RCX;
  char *result;
  string jsongen;
  undefined1 local_bf0 [8];
  MonsterBuilder color_monster;
  undefined1 local_bd8 [4];
  Offset<flatbuffers::String> name;
  FlatBufferBuilder builder;
  char *include_directories [3];
  allocator<char> local_b31;
  string local_b30;
  undefined1 local_b10 [8];
  string include_test_path;
  undefined1 local_7e0 [8];
  Parser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [8];
  string schemafile;
  string *tests_data_path_local;
  
  schemafile.field_2._8_8_ = tests_data_path;
  std::__cxx11::string::string(local_30);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 schemafile.field_2._8_8_,"monster_test.fbs");
  this = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(this,(char *)0x0,SUB81(local_30,0),in_RCX);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.fbs\").c_str(), false, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x15,"");
  std::__cxx11::string::~string((string *)&local_50);
  IDLOptions::IDLOptions((IDLOptions *)((long)&include_test_path.field_2 + 8));
  Parser::Parser((Parser *)local_7e0,(IDLOptions *)((long)&include_test_path.field_2 + 8));
  IDLOptions::~IDLOptions((IDLOptions *)((long)&include_test_path.field_2 + 8));
  path = schemafile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"include_test",&local_b31)
  ;
  ConCatPathFileName((string *)local_b10,(string *)path,&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  builder.string_pool = (StringOffsetMap *)std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)local_7e0,pcVar2,(char **)&builder.string_pool,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(schemafile.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x1d,"");
  parser.known_attributes_._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  parser.opts.use_flexbuffers = true;
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_bd8,0x400,(Allocator *)0x0,false,buffer_minalign)
  ;
  color_monster._12_4_ =
       FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                 ((FlatBufferBuilderImpl<false> *)local_bd8,"default_enum");
  MyGame::Example::MonsterBuilder::MonsterBuilder
            ((MonsterBuilder *)local_bf0,(FlatBufferBuilder *)local_bd8);
  jsongen.field_2._12_4_ = color_monster._12_4_;
  MyGame::Example::MonsterBuilder::add_name
            ((MonsterBuilder *)local_bf0,(Offset<flatbuffers::String>)color_monster._12_4_);
  jsongen.field_2._8_4_ = MyGame::Example::MonsterBuilder::Finish((MonsterBuilder *)local_bf0);
  MyGame::Example::FinishMonsterBuffer
            ((FlatBufferBuilder *)local_bd8,(Offset<MyGame::Example::Monster>)jsongen.field_2._8_4_)
  ;
  std::__cxx11::string::string((string *)&result);
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                         ((FlatBufferBuilderImpl<false> *)local_bd8);
  pcVar2 = GenText((Parser *)local_7e0,flatbuffer,(string *)&result);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x28,"");
  lVar3 = std::__cxx11::string::find((char *)&result,0x28749f);
  TestEq<bool,bool>(lVar3 != -1,true,
                    "\'std::string::npos != jsongen.find(\"color: \\\"Blue\\\"\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2a,"");
  lVar3 = std::__cxx11::string::find((char *)&result,0x2874ee);
  TestEq<bool,bool>(lVar3 != -1,true,
                    "\'std::string::npos != jsongen.find(\"testf: 3.14159\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2c,"");
  std::__cxx11::string::~string((string *)&result);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_bd8);
  std::__cxx11::string::~string((string *)local_b10);
  Parser::~Parser((Parser *)local_7e0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonDefaultTest(const std::string &tests_data_path) {
  // load FlatBuffer schema (.fbs) from disk
  std::string schemafile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.fbs").c_str(),
                                false, &schemafile),
          true);
  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parser;
  auto include_test_path =
      flatbuffers::ConCatPathFileName(tests_data_path, "include_test");
  const char *include_directories[] = { tests_data_path.c_str(),
                                        include_test_path.c_str(), nullptr };

  TEST_EQ(parser.Parse(schemafile.c_str(), include_directories), true);
  // create incomplete monster and store to json
  parser.opts.output_default_scalars_in_json = true;
  parser.opts.output_enum_identifiers = true;
  flatbuffers::FlatBufferBuilder builder;
  auto name = builder.CreateString("default_enum");
  MonsterBuilder color_monster(builder);
  color_monster.add_name(name);
  FinishMonsterBuffer(builder, color_monster.Finish());
  std::string jsongen;
  auto result = GenText(parser, builder.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  // default value of the "color" field is Blue
  TEST_EQ(std::string::npos != jsongen.find("color: \"Blue\""), true);
  // default value of the "testf" field is 3.14159
  TEST_EQ(std::string::npos != jsongen.find("testf: 3.14159"), true);
}